

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O1

void __thiscall
spvtools::opt::LoopUtils::PopulateLoopNest
          (LoopUtils *this,Loop *new_loop,LoopCloningResult *cloning_result)

{
  Loop **__k;
  pointer *pppLVar1;
  Loop *pLVar2;
  iterator iVar3;
  pointer ppLVar4;
  undefined1 old_loop [8];
  mapped_type *ppLVar5;
  TreeDFIterator<spvtools::opt::Loop> *pTVar6;
  Loop *new_loop_00;
  Loop *sub_loop;
  LoopUtils *pLVar7;
  unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
  loop_mapping;
  TreeDFIterator<spvtools::opt::Loop> __begin2;
  TreeDFIterator<spvtools::opt::Loop> __end2;
  Loop *local_1f0;
  LoopUtils *local_1e8;
  LoopCloningResult *local_1e0;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> local_1d8;
  Loop *local_1d0;
  undefined1 local_1c8 [56];
  undefined1 local_190 [8];
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  local_188;
  undefined1 local_138 [88];
  NodePtr local_e0;
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  local_d8;
  NodePtr local_88;
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  _Stack_80;
  
  local_1c8._0_8_ = local_1c8 + 0x30;
  local_1c8._8_8_ = (LoopDescriptor *)0x1;
  local_1c8._16_8_ = (Loop *)0x0;
  local_1c8._24_8_ = (Function *)0x0;
  local_1c8._32_4_ = 1.0;
  local_1c8._40_8_ = 0;
  local_1c8._48_8_ = (__node_base_ptr)0x0;
  __k = &this->loop_;
  pLVar7 = (LoopUtils *)local_1c8;
  local_1e0 = cloning_result;
  ppLVar5 = std::__detail::
            _Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)pLVar7,__k);
  *ppLVar5 = new_loop;
  pLVar2 = this->loop_->parent_;
  local_1e8 = this;
  if (pLVar2 != (Loop *)0x0) {
    local_138._0_8_ = new_loop;
    if (new_loop->parent_ != (Loop *)0x0) {
LAB_005f3d66:
      __assert_fail("!nested->GetParent() && \"The loop has another parent.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.h"
                    ,0xaa,"void spvtools::opt::Loop::AddNestedLoop(Loop *)");
    }
    iVar3._M_current =
         (pLVar2->nested_loops_).
         super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pLVar2->nested_loops_).
        super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pLVar7 = (LoopUtils *)&pLVar2->nested_loops_;
      std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
      _M_realloc_insert<spvtools::opt::Loop*const&>
                ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)pLVar7,iVar3,
                 (Loop **)local_138);
    }
    else {
      *iVar3._M_current = new_loop;
      pppLVar1 = &(pLVar2->nested_loops_).
                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppLVar1 = *pppLVar1 + 1;
    }
    *(Loop **)(local_138._0_8_ + 0x30) = pLVar2;
  }
  PopulateLoopDesc(pLVar7,new_loop,*__k,local_1e0);
  local_190 = (undefined1  [8])*__k;
  local_188._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::_M_initialize_map(&local_188,0);
  if ((local_190 != (undefined1  [8])0x0) &&
     (ppLVar4 = (((ChildrenList *)((long)local_190 + 0x38))->
                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
     ppLVar4 !=
     (((ChildrenList *)((long)local_190 + 0x38))->
     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>)._M_impl.
     super__Vector_impl_data._M_finish)) {
    local_138._0_8_ = local_190;
    local_138._8_8_ = ppLVar4;
    std::
    deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
    ::
    emplace_back<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>
              ((deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
                *)&local_188,
               (pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                *)local_138);
  }
  local_1d0 = new_loop;
  pTVar6 = TreeDFIterator<spvtools::opt::Loop>::operator++
                     ((TreeDFIterator<spvtools::opt::Loop> *)local_190);
  _Stack_80._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_80._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88 = (NodePtr)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::_M_initialize_map(&_Stack_80,0);
  if ((local_88 != (NodePtr)0x0) &&
     (ppLVar4 = (local_88->nested_loops_).
                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     ppLVar4 !=
     (local_88->nested_loops_).
     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    local_138._0_8_ = local_88;
    local_138._8_8_ = ppLVar4;
    std::
    deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
    ::
    emplace_back<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>
              ((deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
                *)&_Stack_80,
               (pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                *)local_138);
  }
  local_138._0_8_ = pTVar6->current_;
  std::
  deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::deque((deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
           *)(local_138 + 8),&(pTVar6->parent_iterators_).c);
  local_e0 = local_88;
  std::
  deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::deque((deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
           *)&local_d8,
          (deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
           *)&_Stack_80);
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base(&_Stack_80);
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base(&local_188);
  local_190 = (undefined1  [8])local_138._0_8_;
  std::
  deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::deque((deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
           *)&local_188,
          (deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
           *)(local_138 + 8));
  local_88 = local_e0;
  std::
  deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::deque((deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
           *)&_Stack_80,
          (deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
           *)&local_d8);
  if (local_190 != (undefined1  [8])local_88) {
    do {
      old_loop = local_190;
      new_loop_00 = (Loop *)operator_new(0x90);
      new_loop_00->context_ = local_1e8->context_;
      (new_loop_00->nested_loops_).
      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (new_loop_00->nested_loops_).
      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_loop_00->loop_latch_ = (BasicBlock *)0x0;
      new_loop_00->parent_ = (Loop *)0x0;
      new_loop_00->loop_merge_ = (BasicBlock *)0x0;
      new_loop_00->loop_preheader_ = (BasicBlock *)0x0;
      new_loop_00->loop_header_ = (BasicBlock *)0x0;
      new_loop_00->loop_continue_ = (BasicBlock *)0x0;
      (new_loop_00->nested_loops_).
      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (new_loop_00->loop_basic_blocks_)._M_h._M_buckets =
           &(new_loop_00->loop_basic_blocks_)._M_h._M_single_bucket;
      (new_loop_00->loop_basic_blocks_)._M_h._M_bucket_count = 1;
      (new_loop_00->loop_basic_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (new_loop_00->loop_basic_blocks_)._M_h._M_element_count = 0;
      (new_loop_00->loop_basic_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (new_loop_00->loop_basic_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
      (new_loop_00->loop_basic_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      new_loop_00->loop_is_marked_for_removal_ = false;
      local_1f0 = *(Loop **)((long)old_loop + 0x30);
      ppLVar5 = std::__detail::
                _Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_1c8,&local_1f0);
      pLVar2 = *ppLVar5;
      if (pLVar2 != (Loop *)0x0) {
        local_1f0 = new_loop_00;
        if (new_loop_00->parent_ != (Loop *)0x0) goto LAB_005f3d66;
        iVar3._M_current =
             (pLVar2->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (pLVar2->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
          _M_realloc_insert<spvtools::opt::Loop*const&>
                    ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
                     &pLVar2->nested_loops_,iVar3,&local_1f0);
        }
        else {
          *iVar3._M_current = new_loop_00;
          pppLVar1 = &(pLVar2->nested_loops_).
                      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppLVar1 = *pppLVar1 + 1;
        }
        local_1f0->parent_ = pLVar2;
      }
      local_1f0 = (Loop *)old_loop;
      pLVar7 = (LoopUtils *)local_1c8;
      ppLVar5 = std::__detail::
                _Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_1c8,&local_1f0);
      *ppLVar5 = new_loop_00;
      PopulateLoopDesc(pLVar7,new_loop_00,(Loop *)old_loop,local_1e0);
      TreeDFIterator<spvtools::opt::Loop>::operator++
                ((TreeDFIterator<spvtools::opt::Loop> *)local_190);
    } while (local_190 != (undefined1  [8])local_88);
  }
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base(&_Stack_80);
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base(&local_188);
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base(&local_d8);
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)(local_138 + 8));
  local_1d8._M_head_impl = local_1d0;
  LoopDescriptor::AddLoopNest
            (local_1e8->loop_desc_,
             (unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *)
             &local_1d8);
  if (local_1d8._M_head_impl != (Loop *)0x0) {
    std::default_delete<spvtools::opt::Loop>::operator()
              ((default_delete<spvtools::opt::Loop> *)&local_1d8,local_1d8._M_head_impl);
  }
  local_1d8._M_head_impl = (Loop *)0x0;
  std::
  _Hashtable<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Loop_*,_std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Loop_*>,_std::hash<spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1c8);
  return;
}

Assistant:

void LoopUtils::PopulateLoopNest(
    Loop* new_loop, const LoopCloningResult& cloning_result) const {
  std::unordered_map<Loop*, Loop*> loop_mapping;
  loop_mapping[loop_] = new_loop;

  if (loop_->HasParent()) loop_->GetParent()->AddNestedLoop(new_loop);
  PopulateLoopDesc(new_loop, loop_, cloning_result);

  for (Loop& sub_loop :
       make_range(++TreeDFIterator<Loop>(loop_), TreeDFIterator<Loop>())) {
    Loop* cloned = new Loop(context_);
    if (Loop* parent = loop_mapping[sub_loop.GetParent()])
      parent->AddNestedLoop(cloned);
    loop_mapping[&sub_loop] = cloned;
    PopulateLoopDesc(cloned, &sub_loop, cloning_result);
  }

  loop_desc_->AddLoopNest(std::unique_ptr<Loop>(new_loop));
}